

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O2

IBot<uttt::IBoard> * __thiscall
generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::Clone
          (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *this)

{
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *this_00;
  
  this_00 = (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *)
            operator_new(0x18);
  MinimaxBot(this_00,(this->super_IBot<uttt::IBoard>).game,this->depth);
  return &this_00->super_IBot<uttt::IBoard>;
}

Assistant:

game::IBot<IGame> *Clone() const
    {
        return new MinimaxBot(this->game, depth);
    }